

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

OptimizerResult
TasGrid::Optimizer::performSecantSearch<(TasGrid::TypeOneDRule)15>
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double left,double right)

{
  OptimizerResult OVar1;
  OptimizerResult OVar2;
  uint uVar3;
  double dVar4;
  OptimizerResult OVar5;
  OptimizerResult OVar6;
  anon_class_8_1_c685f059 func;
  anon_class_8_1_c685f059 local_30;
  double local_28;
  
  local_30.current = current;
  OVar5 = performSecantSearch<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                    (&local_30,left);
  local_28 = OVar5.value;
  OVar6 = performSecantSearch<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                    (&local_30,right);
  if (ABS(OVar6.value) <= ABS(local_28)) {
    OVar2.value = local_28;
    OVar2.node = OVar5.node;
  }
  else {
    OVar1.value = local_28;
    OVar1.node = OVar5.node;
    OVar2 = OVar6;
    OVar6 = OVar1;
  }
  uVar3 = 0;
  while( true ) {
    OVar5 = OVar6;
    dVar4 = OVar5.value;
    if ((ABS(dVar4) <= 3e-12) || (999 < uVar3)) break;
    OVar6 = performSecantSearch<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                      (&local_30,
                       OVar5.node - ((OVar5.node - OVar2.node) * dVar4) / (dVar4 - OVar2.value));
    uVar3 = uVar3 + 1;
    OVar2 = OVar5;
  }
  return OVar5;
}

Assistant:

OptimizerResult performSecantSearch(CurrentNodes<rule> const& current, double left, double right){
    auto func = [&](double x)->OptimizerResult{ return {x, getDerivative<rule>(current, x)}; };

    OptimizerResult past    = func(left);
    OptimizerResult present = func(right);

    if (std::abs(past.value) < std::abs(present.value))
        std::swap(past, present);

    int iterations = 0;
    while((std::abs(present.value) > 3.0 * Maths::num_tol) && (iterations < 1000)){ // 1000 guards against stagnation
        OptimizerResult future = func(present.node - present.value * (present.node - past.node) / (present.value - past.value));
        past    = present;
        present = future;
        iterations++;
    }

    return present;
}